

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdout_color_sinks-inl.h
# Opt level: O2

shared_ptr<spdlog::logger>
spdlog::stdout_color_st<spdlog::async_factory_impl<(spdlog::async_overflow_policy)0>>
          (string *logger_name,color_mode mode)

{
  undefined8 uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  shared_ptr<spdlog::logger> sVar2;
  undefined1 local_48 [48];
  
  std::__cxx11::string::string
            ((string *)(local_48 + 0x10),(string *)CONCAT44(in_register_00000034,mode));
  async_factory_impl<(spdlog::async_overflow_policy)0>::
  create<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_nullmutex>,spdlog::color_mode&>
            ((string *)local_48,(color_mode *)(local_48 + 0x10));
  uVar1 = local_48._8_8_;
  local_48._8_8_ = 0;
  (logger_name->_M_dataplus)._M_p = (pointer)local_48._0_8_;
  logger_name->_M_string_length = uVar1;
  local_48._0_8_ = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  std::__cxx11::string::~string((string *)(local_48 + 0x10));
  sVar2.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)logger_name;
  return (shared_ptr<spdlog::logger>)
         sVar2.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SPDLOG_INLINE std::shared_ptr<logger> stdout_color_st(const std::string &logger_name,
                                                      color_mode mode) {
    return Factory::template create<sinks::stdout_color_sink_st>(logger_name, mode);
}